

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

SecAttrOvr * getsecattrovr(GlobalVars *gv,char *name,uint32_t flags)

{
  int iVar1;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  SecAttrOvr *sao;
  SecAttrOvr *local_20;
  char *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_10 = "";
  }
  for (local_20 = *(SecAttrOvr **)(in_RDI + 0xd0);
      (local_20 != (SecAttrOvr *)0x0 &&
      ((iVar1 = strcmp(local_20->name,local_10), iVar1 != 0 || ((local_20->flags & in_EDX) == 0))));
      local_20 = local_20->next) {
  }
  return local_20;
}

Assistant:

struct SecAttrOvr *getsecattrovr(struct GlobalVars *gv,const char *name,
                                 uint32_t flags)
/* Return a SecAttrOvr node which matches section name and flags. */
{
  struct SecAttrOvr *sao;

  if (name == NULL)
    name = noname;
  for (sao=gv->secattrovrs; sao!=NULL; sao=sao->next) {
    if (!strcmp(sao->name,name) && (sao->flags & flags)!=0)
      break;
  }
  return sao;
}